

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRSDA.cpp
# Opt level: O2

void __thiscall chrono::ChLinkRSDA::ChLinkRSDA(ChLinkRSDA *this)

{
  ChLink::ChLink(&this->super_ChLink);
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkRSDA_01166398;
  (this->m_csys1).pos.m_data[0] = 0.0;
  (this->m_csys1).pos.m_data[1] = 0.0;
  (this->m_csys1).pos.m_data[2] = 0.0;
  (this->m_csys1).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->m_csys1).rot.m_data + 1) = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])((this->m_csys1).rot.m_data + 3) = ZEXT432(0) << 0x40;
  (this->m_csys2).rot.m_data[0] = 1.0;
  *(undefined1 (*) [64])((this->m_csys2).rot.m_data + 1) = ZEXT464(0) << 0x20;
  *(undefined1 (*) [64])((long)(this->m_axis).m_data + 4) = ZEXT464(0) << 0x20;
  this->m_auto_rest_angle = true;
  this->m_rest_angle = 0.0;
  this->m_torque = 0.0;
  return;
}

Assistant:

ChLinkRSDA::ChLinkRSDA() : m_turns(0), m_auto_rest_angle(true), m_rest_angle(0), m_torque(0), m_k(0), m_r(0), m_t(0) {}